

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLMeshLoader14.cpp
# Opt level: O2

bool __thiscall
COLLADASaxFWL::MeshLoader14::begin__lines(MeshLoader14 *this,lines__AttributeData *attributeData)

{
  int iVar1;
  bool bVar2;
  lines__AttributeData attrData;
  uint local_20 [2];
  ParserChar *local_18;
  uint64 local_10;
  ParserChar *local_8;
  
  local_18 = attributeData->name;
  local_8 = attributeData->material;
  bVar2 = (attributeData->present_attributes & 1) != 0;
  if (bVar2) {
    local_10 = attributeData->count;
  }
  local_20[0] = (uint)bVar2;
  iVar1 = (*(this->mLoader->super_SourceArrayLoader).super_FilePartLoader.super_IFilePartLoader.
            super_ExtraDataLoader._vptr_ExtraDataLoader[0x28])(this->mLoader,local_20);
  return SUB41(iVar1,0);
}

Assistant:

bool MeshLoader14::begin__lines( const COLLADASaxFWL14::lines__AttributeData& attributeData )
{
SaxVirtualFunctionTest14(begin__lines(attributeData));
COLLADASaxFWL::lines__AttributeData attrData;
attrData.present_attributes = 0;
attrData.name = attributeData.name;
attrData.material = attributeData.material;
if ( (attributeData.present_attributes & COLLADASaxFWL14::lines__AttributeData::ATTRIBUTE_COUNT_PRESENT) == COLLADASaxFWL14::lines__AttributeData::ATTRIBUTE_COUNT_PRESENT ) {
    attrData.count = attributeData.count;
    attrData.present_attributes |= COLLADASaxFWL::lines__AttributeData::ATTRIBUTE_COUNT_PRESENT;
}
return mLoader->begin__lines(attrData);
}